

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::ParseObject
               (SnapObject *snpObject,bool readSeparator,FileReader *reader,SlabAllocator *alloc,
               SnapObjectVTable *vtable,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *ptrIdToTypeMap)

{
  SnapHandler *pSVar1;
  bool bVar2;
  SnapObjectType SVar3;
  uint uVar4;
  int iVar5;
  uint32 uVar6;
  TTD_PTR_ID TVar7;
  TTD_WELLKNOWN_TOKEN pcVar8;
  SnapType **ppSVar9;
  DependsOnInfo *pDVar10;
  unsigned_long *puVar11;
  undefined4 extraout_var;
  void **ppvVar12;
  TTDVar pvVar13;
  FileReader *reader_00;
  fPtr_ParseAddtlInfo addtlInfoParse;
  bool readVarSeparator;
  uint32 i_1;
  SnapHandler *handler;
  uint32 i;
  bool isDepOn;
  bool hasWellKnownToken;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *ptrIdToTypeMap_local;
  SnapObjectVTable *vtable_local;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  bool readSeparator_local;
  SnapObject *snpObject_local;
  
  (*reader->_vptr_FileReader[6])
            (reader,(ulong)readSeparator & 1,reader,
             CONCAT71((int7)((ulong)alloc >> 8),readSeparator) & 0xffffffffffffff01);
  TVar7 = FileReader::ReadAddr(reader,objectId,false);
  snpObject->ObjectPtrId = TVar7;
  SVar3 = FileReader::ReadTag<TTD::NSSnapObjects::SnapObjectType>(reader,objectType,true);
  snpObject->SnapObjectTag = SVar3;
  uVar4 = (*reader->_vptr_FileReader[10])(reader,0x19,1);
  snpObject->OptWellKnownToken = (TTD_WELLKNOWN_TOKEN)0x0;
  if ((uVar4 & 1) != 0) {
    pcVar8 = FileReader::ReadWellKnownToken<TTD::SlabAllocatorBase<0>>
                       (reader,wellKnownToken,alloc,true);
    snpObject->OptWellKnownToken = pcVar8;
  }
  TVar7 = FileReader::ReadAddr(reader,typeId,true);
  ppSVar9 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::LookupKnownItem
                      (ptrIdToTypeMap,TVar7);
  snpObject->SnapType = *ppSVar9;
  iVar5 = (*reader->_vptr_FileReader[10])(reader,0x1b,1);
  snpObject->IsCrossSite = (uint)((byte)iVar5 & 1);
  snpObject->OptDependsOnInfo = (DependsOnInfo *)0x0;
  uVar4 = (*reader->_vptr_FileReader[10])(reader,0x4d,1);
  if ((uVar4 & 1) != 0) {
    pDVar10 = SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::DependsOnInfo>(alloc);
    snpObject->OptDependsOnInfo = pDVar10;
    uVar6 = FileReader::ReadLengthValue(reader,true);
    snpObject->OptDependsOnInfo->DepOnCount = uVar6;
    puVar11 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>
                        (alloc,(ulong)snpObject->OptDependsOnInfo->DepOnCount);
    snpObject->OptDependsOnInfo->DepOnPtrArray = puVar11;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    for (handler._0_4_ = 0; (uint)handler < snpObject->OptDependsOnInfo->DepOnCount;
        handler._0_4_ = (uint)handler + 1) {
      iVar5 = (*reader->_vptr_FileReader[0x10])(reader,(ulong)((uint)handler != 0));
      snpObject->OptDependsOnInfo->DepOnPtrArray[(uint)handler] = CONCAT44(extraout_var,iVar5);
    }
    (*reader->_vptr_FileReader[5])();
  }
  bVar2 = Js::DynamicType::Is(snpObject->SnapType->JsTypeId);
  if (bVar2) {
    pSVar1 = snpObject->SnapType->TypeHandlerInfo;
    TVar7 = FileReader::ReadAddr(reader,objectId,true);
    snpObject->OptIndexedObjectArray = TVar7;
    uVar6 = FileReader::ReadLengthValue(reader,true);
    snpObject->VarArrayCount = uVar6;
    if (pSVar1->MaxPropertyIndex == 0) {
      snpObject->VarArray = (TTDVar *)0x0;
    }
    else {
      ppvVar12 = SlabAllocatorBase<0>::SlabAllocateArray<void*>
                           (alloc,(ulong)snpObject->VarArrayCount);
      snpObject->VarArray = ppvVar12;
      FileReader::ReadSequenceStart_WDefaultKey(reader,true);
      for (addtlInfoParse._4_4_ = 0; addtlInfoParse._4_4_ < pSVar1->MaxPropertyIndex;
          addtlInfoParse._4_4_ = addtlInfoParse._4_4_ + 1) {
        if (pSVar1->PropertyInfoArray[addtlInfoParse._4_4_].DataKind == Clear) {
          (*reader->_vptr_FileReader[8])(reader,addtlInfoParse._4_4_ != 0);
        }
        else {
          (*reader->_vptr_FileReader[6])(reader,addtlInfoParse._4_4_ != 0);
          FileReader::ReadUInt32(reader,pid,false);
          (*reader->_vptr_FileReader[3])(reader,3,1);
          pvVar13 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_00);
          snpObject->VarArray[addtlInfoParse._4_4_] = pvVar13;
          (*reader->_vptr_FileReader[7])();
        }
      }
      (*reader->_vptr_FileReader[5])();
    }
  }
  if (vtable[snpObject->SnapObjectTag].ParseAddtlInfoFunc != (fPtr_ParseAddtlInfo)0x0) {
    (*vtable[snpObject->SnapObjectTag].ParseAddtlInfoFunc)(snpObject,reader,alloc);
  }
  (*reader->_vptr_FileReader[7])();
  return;
}

Assistant:

void ParseObject(SnapObject* snpObject, bool readSeparator, FileReader* reader, SlabAllocator& alloc, const SnapObjectVTable* vtable, const TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*>& ptrIdToTypeMap)
        {
            reader->ReadRecordStart(readSeparator);

            snpObject->ObjectPtrId = reader->ReadAddr(NSTokens::Key::objectId);
            snpObject->SnapObjectTag = reader->ReadTag<SnapObjectType>(NSTokens::Key::objectType, true);

            bool hasWellKnownToken = reader->ReadBool(NSTokens::Key::isWellKnownToken, true);
            snpObject->OptWellKnownToken = TTD_INVALID_WELLKNOWN_TOKEN;
            if(hasWellKnownToken)
            {
                snpObject->OptWellKnownToken = reader->ReadWellKnownToken(NSTokens::Key::wellKnownToken, alloc, true);
            }

            snpObject->SnapType = ptrIdToTypeMap.LookupKnownItem(reader->ReadAddr(NSTokens::Key::typeId, true));

            snpObject->IsCrossSite = reader->ReadBool(NSTokens::Key::isCrossSite, true);

#if ENABLE_OBJECT_SOURCE_TRACKING
            reader->ReadKey(NSTokens::Key::originInfo, true);
            ParseDiagnosticOriginInformation(snpObject->DiagOriginInfo, false, reader);
#endif

            snpObject->OptDependsOnInfo = nullptr;
            bool isDepOn = reader->ReadBool(NSTokens::Key::isDepOn, true);
            if(isDepOn)
            {
                snpObject->OptDependsOnInfo = alloc.SlabAllocateStruct<DependsOnInfo>();

                snpObject->OptDependsOnInfo->DepOnCount = reader->ReadLengthValue(true);
                snpObject->OptDependsOnInfo->DepOnPtrArray = alloc.SlabAllocateArray<TTD_PTR_ID>(snpObject->OptDependsOnInfo->DepOnCount);

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = 0; i < snpObject->OptDependsOnInfo->DepOnCount; ++i)
                {
                    snpObject->OptDependsOnInfo->DepOnPtrArray[i] = reader->ReadNakedAddr(i != 0);
                }
                reader->ReadSequenceEnd();
            }

            if(Js::DynamicType::Is(snpObject->SnapType->JsTypeId))
            {
                const NSSnapType::SnapHandler* handler = snpObject->SnapType->TypeHandlerInfo;

                snpObject->OptIndexedObjectArray = reader->ReadAddr(NSTokens::Key::objectId, true);

                snpObject->VarArrayCount = reader->ReadLengthValue(true);
                if(handler->MaxPropertyIndex == 0)
                {
                    snpObject->VarArray = nullptr;
                }
                else
                {
                    snpObject->VarArray = alloc.SlabAllocateArray<TTDVar>(snpObject->VarArrayCount);

                    reader->ReadSequenceStart_WDefaultKey(true);
                    for(uint32 i = 0; i < handler->MaxPropertyIndex; ++i)
                    {
                        bool readVarSeparator = i != 0;

                        if(handler->PropertyInfoArray[i].DataKind == NSSnapType::SnapEntryDataKindTag::Clear)
                        {
                            reader->ReadNakedNull(readVarSeparator);
                        }
                        else
                        {
#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                            reader->ReadRecordStart(readVarSeparator);
                            reader->ReadUInt32(NSTokens::Key::pid);
                            reader->ReadKey(NSTokens::Key::entry, true);

                            readVarSeparator = false;
#endif

                            snpObject->VarArray[i] = NSSnapValues::ParseTTDVar(readVarSeparator, reader);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                            reader->ReadRecordEnd();
#endif
                        }
                    }
                    reader->ReadSequenceEnd();
                }
            }

            fPtr_ParseAddtlInfo addtlInfoParse = vtable[(uint32)snpObject->SnapObjectTag].ParseAddtlInfoFunc;
            if(addtlInfoParse != nullptr)
            {
                addtlInfoParse(snpObject, reader, alloc);
            }

            reader->ReadRecordEnd();
        }